

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  int *piVar1;
  PlatformInterface *pPVar2;
  long *plVar3;
  undefined8 uVar4;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  size_t sVar7;
  size_t sVar8;
  char *__s;
  size_t sVar9;
  undefined8 *puVar10;
  long *plVar11;
  Parameters *pPVar12;
  Parameters *extraout_RDX;
  long lVar13;
  size_type __n;
  ulong uVar14;
  bool bVar15;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  objects;
  Environment env;
  Resources res_1;
  Resources res;
  undefined1 local_2e8 [16];
  pointer local_2d8;
  VkAllocationCallbacks *pVStack_2d0;
  Context *local_2c0;
  Move<vk::Handle<(vk::HandleType)18>_> local_2b8;
  Environment local_290;
  undefined1 local_258 [8];
  undefined1 auStack_250 [16];
  VkAllocationCallbacks *pVStack_240;
  ios_base local_1e0 [272];
  undefined1 local_d0 [160];
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_d0,allocator,0x400);
  pPVar2 = context->m_platformInterface;
  pDVar5 = Context::getDeviceInterface(context);
  pVVar6 = Context::getDevice(context);
  local_290.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  pPVar12 = (Parameters *)context->m_progCollection;
  local_290.allocationCallbacks = (VkAllocationCallbacks *)(local_d0 + 8);
  local_290.maxResourceConsumers = 1;
  local_290.vkp = pPVar2;
  local_290.vkd = pDVar5;
  local_290.device = pVVar6;
  local_290.programBinaries = (BinaryCollection *)pPVar12;
  ComputePipeline::Resources::Resources
            ((Resources *)local_258,&local_290,(Parameters *)local_290.allocationCallbacks);
  sVar7 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_d0);
  ComputePipeline::create(&local_2b8,&local_290,(Resources *)local_258,pPVar12);
  local_2d8 = (pointer)local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                       m_device;
  pVStack_2d0 = local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_2e8._0_8_ =
       local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_2e8._8_8_ =
       local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  sVar8 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_d0);
  if (local_2e8._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(local_2e8 + 8),
               (VkPipeline)local_2e8._0_8_);
  }
  ComputePipeline::Resources::~Resources((Resources *)local_258);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_d0);
  sVar7 = getSafeObjectCount(context,sVar8 - sVar7,0);
  __n = 0x4000;
  if (sVar7 < 0x4000) {
    __n = sVar7;
  }
  local_290.vkp = context->m_platformInterface;
  local_290.vkd = Context::getDeviceInterface(context);
  local_290.device = Context::getDevice(context);
  local_290.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_290.programBinaries = context->m_progCollection;
  local_290.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_290.maxResourceConsumers = (deUint32)__n;
  ComputePipeline::Resources::Resources((Resources *)local_d0,&local_290,extraout_RDX);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
            *)local_2e8,__n,(allocator_type *)local_258);
  local_258 = (undefined1  [8])context->m_testCtx->m_log;
  local_2c0 = context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_250);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_250,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)auStack_250);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_250," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)18>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(auStack_250._0_8_ - 0x18) +
                    (int)(ostringstream *)auStack_250);
  }
  else {
    sVar9 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_250,__s,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_250," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_258,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_250);
  std::ios_base::~ios_base(local_1e0);
  if (sVar7 != 0) {
    lVar13 = 8;
    uVar14 = 0;
    do {
      puVar10 = (undefined8 *)operator_new(0x20);
      ComputePipeline::create
                ((Move<vk::Handle<(vk::HandleType)18>_> *)local_258,&local_290,(Resources *)local_d0
                 ,pPVar12);
      puVar10[2] = auStack_250._8_8_;
      puVar10[3] = pVStack_240;
      *puVar10 = local_258;
      puVar10[1] = auStack_250._0_8_;
      local_258 = (undefined1  [8])0x0;
      auStack_250._0_8_ = 0;
      auStack_250._8_8_ = (VkDevice)0x0;
      pVStack_240 = (VkAllocationCallbacks *)0x0;
      plVar11 = (long *)operator_new(0x20);
      uVar4 = local_2e8._0_8_;
      *(undefined4 *)(plVar11 + 1) = 0;
      *(undefined4 *)((long)plVar11 + 0xc) = 0;
      *plVar11 = (long)&PTR__SharedPtrState_00d1e0d0;
      plVar11[2] = (long)puVar10;
      *(undefined4 *)(plVar11 + 1) = 1;
      *(undefined4 *)((long)plVar11 + 0xc) = 1;
      plVar3 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)local_2e8._0_8_ + lVar13
                         );
      if (plVar3 != plVar11) {
        if (plVar3 != (long *)0x0) {
          LOCK();
          plVar3 = plVar3 + 1;
          *(int *)plVar3 = (int)*plVar3 + -1;
          UNLOCK();
          if ((int)*plVar3 == 0) {
            *(undefined8 *)(local_2e8._0_8_ + lVar13 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)
                                           local_2e8._0_8_ + lVar13) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)uVar4 +
                                    lVar13) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar3 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)uVar4 + lVar13);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)uVar4 + lVar13) = 0;
          }
        }
        *(undefined8 **)(uVar4 + lVar13 + -8) = puVar10;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)uVar4 + lVar13) = plVar11;
        LOCK();
        *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)18>_> **)uVar4 + lVar13)
                        + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar3 = plVar11 + 1;
      *(int *)plVar3 = (int)*plVar3 + -1;
      UNLOCK();
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar11 + 0x10))(plVar11);
      }
      LOCK();
      piVar1 = (int *)((long)plVar11 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar11 + 8))(plVar11);
      }
      if (local_258 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)18>_> *)auStack_250,(VkPipeline)local_258);
      }
      bVar15 = (uVar14 & 0x3ff) != 0;
      pPVar12 = (Parameters *)CONCAT71((int7)((ulong)pPVar12 >> 8),bVar15 || uVar14 == 0);
      if (!bVar15 && uVar14 != 0) {
        tcu::TestContext::touchWatchdog(local_2c0->m_testCtx);
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x10;
    } while (__n != uVar14);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                     *)local_2e8,(pointer)local_2e8._0_8_);
  local_258 = (undefined1  [8])(auStack_250 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_258,
             (undefined1 *)((long)(ProgramFormat *)local_258 + auStack_250._0_8_));
  if (local_258 != (undefined1  [8])(auStack_250 + 8)) {
    operator_delete((void *)local_258,(ulong)(auStack_250._8_8_ + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
             *)local_2e8);
  ComputePipeline::Resources::~Resources((Resources *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}